

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Marshal.c
# Opt level: O0

UINT16 TPMS_CLOCK_INFO_Marshal(TPMS_CLOCK_INFO *source,BYTE **buffer,INT32 *size)

{
  UINT16 UVar1;
  UINT16 UVar2;
  UINT16 UVar3;
  UINT16 UVar4;
  UINT16 result;
  INT32 *size_local;
  BYTE **buffer_local;
  TPMS_CLOCK_INFO *source_local;
  
  UVar1 = UINT64_Marshal(&source->clock,buffer,size);
  UVar2 = UINT32_Marshal(&source->resetCount,buffer,size);
  UVar3 = UINT32_Marshal(&source->restartCount,buffer,size);
  UVar4 = UINT8_Marshal(&source->safe,buffer,size);
  return UVar1 + UVar2 + UVar3 + UVar4;
}

Assistant:

UINT16
TPMS_CLOCK_INFO_Marshal(TPMS_CLOCK_INFO *source, BYTE **buffer, INT32 *size)
{
    UINT16    result = 0;
    result = (UINT16)(result + UINT64_Marshal((UINT64 *)&(source->clock), buffer, size));
    result = (UINT16)(result + UINT32_Marshal((UINT32 *)&(source->resetCount), buffer, size));
    result = (UINT16)(result + UINT32_Marshal((UINT32 *)&(source->restartCount), buffer, size));
    result = (UINT16)(result + TPMI_YES_NO_Marshal((TPMI_YES_NO *)&(source->safe), buffer, size));
    return result;
}